

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL DeleteFileA(LPCSTR lpFileName)

{
  undefined8 lpPath;
  int iVar1;
  PAL_ERROR PVar2;
  void *pvVar3;
  size_t sVar4;
  char *__name;
  PAL_ERROR *pPVar5;
  BOOL BVar6;
  ulong count;
  long in_FS_OFFSET;
  undefined1 local_78 [8];
  PathCharString lpUnixFileNamePS;
  
  lpUnixFileNamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  lpUnixFileNamePS._32_8_ = local_78;
  lpUnixFileNamePS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012378b;
  pvVar3 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar3 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  sVar4 = strlen(lpFileName);
  count = (ulong)(int)sVar4;
  StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,count);
  lpPath = lpUnixFileNamePS._32_8_;
  BVar6 = 0;
  if (lpUnixFileNamePS._32_8_ != 0) {
    strcpy_s((char *)lpUnixFileNamePS._32_8_,(size_t)lpUnixFileNamePS.m_buffer,lpFileName);
    if (count < lpUnixFileNamePS.m_size) {
      lpUnixFileNamePS.m_size = count;
    }
    *(undefined1 *)(lpUnixFileNamePS._32_8_ + lpUnixFileNamePS.m_size) = 0;
    FILEDosToUnixPathA((LPSTR)lpPath);
    pvVar3 = CorUnix::InternalMalloc(0x401);
    if (pvVar3 == (void *)0x0) {
      BVar6 = 0;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012378b;
    }
    else {
      memset(pvVar3,0,0x401);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012378b;
      CorUnix::InternalFree(pvVar3);
      __name = CorUnix::InternalStrdup((char *)lpPath);
      if (__name == (char *)0x0) {
        BVar6 = 0;
      }
      else {
        iVar1 = unlink(__name);
        BVar6 = 1;
        if (iVar1 < 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012378b;
          PVar2 = FILEGetLastErrorFromErrnoAndFilename(__name);
          BVar6 = 0;
          if (PVar2 != 0) {
            pPVar5 = (PAL_ERROR *)__errno_location();
            *pPVar5 = PVar2;
            BVar6 = 0;
          }
        }
        CorUnix::InternalFree(__name);
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != lpUnixFileNamePS.m_count) {
      __stack_chk_fail();
    }
    return BVar6;
  }
LAB_0012378b:
  abort();
}

Assistant:

BOOL
PALAPI
DeleteFileA(
        IN LPCSTR lpFileName)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    int     result;
    BOOL    bRet = FALSE;
    DWORD   dwLastError = 0;
    char * lpUnixFileName;
    int length;
    PathCharString lpUnixFileNamePS;
    LPSTR lpFullUnixFileName = NULL;
    DWORD cchFullUnixFileName = MAX_LONGPATH+1;// InternalCanonicalizeRealPath requires this to be at least PATH_MAX

    PERF_ENTRY(DeleteFileA);
    ENTRY("DeleteFileA(lpFileName=%p (%s))\n", lpFileName?lpFileName:"NULL", lpFileName?lpFileName:"NULL");

    pThread = InternalGetCurrentThread();
    length = strlen(lpFileName);

    lpUnixFileName = lpUnixFileNamePS.OpenStringBuffer(length);
    if (NULL == lpUnixFileName)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( lpUnixFileName, lpUnixFileNamePS.GetSizeOf(), lpFileName);
    lpUnixFileNamePS.CloseBuffer(length);
    
    FILEDosToUnixPathA( lpUnixFileName );

    lpFullUnixFileName =  reinterpret_cast<LPSTR>(InternalMalloc(cchFullUnixFileName));
    if ( lpFullUnixFileName == NULL )
    {
        ERROR("InternalMalloc() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    // Initialize the path to zeroes...
    ZeroMemory(lpFullUnixFileName, cchFullUnixFileName);
    
    // Compute the absolute pathname to the file.  This pathname is used
    // to determine if two file names represent the same file.
    palError = InternalCanonicalizeRealPath(lpUnixFileName, lpFullUnixFileName, cchFullUnixFileName);
    if (palError != NO_ERROR)
    {
        InternalFree(lpFullUnixFileName);
        lpFullUnixFileName = InternalStrdup(lpUnixFileName);
        if (!lpFullUnixFileName)
        {
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto done;
        }
    }

    result = unlink( lpFullUnixFileName );

    if (result < 0)
    {
        TRACE("unlink returns %d\n", result);
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(lpFullUnixFileName);
    }
    else
    {
        bRet = TRUE;
    }

done:
    if(dwLastError)
    {
        pThread->SetLastError( dwLastError );
    }
    if (NULL != lpFullUnixFileName)
    {
        InternalFree(lpFullUnixFileName);
    }
    LOGEXIT("DeleteFileA returns BOOL %d\n", bRet);
    PERF_EXIT(DeleteFileA);
    return bRet;
}